

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:439:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:441:10)>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:439:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:441:10)>_>
              *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    TransformPromiseNodeBase::dropDependency((TransformPromiseNodeBase *)pointer);
    *(undefined ***)pointer = &PTR_onReady_0064c750;
    plVar1 = *(long **)((long)pointer + 0x10);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x30);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }